

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

void recharged_notice(object *obj,_Bool all)

{
  char *pcVar1;
  char o_name [120];
  char acStack_98 [128];
  
  if ((player->opts).opt[0x14] == false) {
    if (obj->note != 0) {
      pcVar1 = quark_str(obj->note);
      while (pcVar1 = strchr(pcVar1,0x21), pcVar1 != (char *)0x0) {
        if (pcVar1[1] == '!') goto LAB_0014755d;
        pcVar1 = pcVar1 + 1;
      }
    }
  }
  else {
LAB_0014755d:
    object_desc(acStack_98,0x78,obj,0,player);
    disturb(player);
    if (obj->number < 2) {
      pcVar1 = "The %s has recharged.";
      if (obj->artifact == (artifact *)0x0) {
        pcVar1 = "Your %s has recharged.";
      }
    }
    else {
      pcVar1 = "One of your %s has recharged.";
      if (all) {
        pcVar1 = "Your %s have recharged.";
      }
    }
    msg(pcVar1,acStack_98);
  }
  return;
}

Assistant:

static void recharged_notice(const struct object *obj, bool all)
{
	char o_name[120];

	const char *s;

	bool notify = false;

	if (OPT(player, notify_recharge)) {
		notify = true;
	} else if (obj->note) {
		/* Find a '!' */
		s = strchr(quark_str(obj->note), '!');

		/* Process notification request */
		while (s) {
			/* Find another '!' */
			if (s[1] == '!') {
				notify = true;
				break;
			}

			/* Keep looking for '!'s */
			s = strchr(s + 1, '!');
		}
	}

	if (!notify) return;

	/* Describe (briefly) */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Disturb the player */
	disturb(player);

	/* Notify the player */
	if (obj->number > 1) {
		if (all) msg("Your %s have recharged.", o_name);
		else msg("One of your %s has recharged.", o_name);
	} else if (obj->artifact)
		msg("The %s has recharged.", o_name);
	else
		msg("Your %s has recharged.", o_name);
}